

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAssemblerLabel.cpp
# Opt level: O3

void __thiscall CDirectiveFunction::writeTempData(CDirectiveFunction *this,TempData *tempData)

{
  CAssemblerCommand *pCVar1;
  
  (**(code **)((long)(((this->label)._M_t.
                       super___uniq_ptr_impl<CAssemblerLabel,_std::default_delete<CAssemblerLabel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CAssemblerLabel_*,_std::default_delete<CAssemblerLabel>_>
                       .super__Head_base<0UL,_CAssemblerLabel_*,_false>._M_head_impl)->
                     super_CAssemblerCommand)._vptr_CAssemblerCommand + 0x20))();
  CAssemblerCommand::applyFileInfo
            ((this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl);
  pCVar1 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  (*pCVar1->_vptr_CAssemblerCommand[4])(pCVar1,tempData);
  return;
}

Assistant:

void CDirectiveFunction::writeTempData(TempData& tempData) const
{
	label->writeTempData(tempData);
	content->applyFileInfo();
	content->writeTempData(tempData);
}